

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O3

void __thiscall cmValueWithOrigin::~cmValueWithOrigin(cmValueWithOrigin *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&(this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>)
  ;
  pcVar1 = (this->Value)._M_dataplus._M_p;
  paVar2 = &(this->Value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmValueWithOrigin(const std::string &value,
                          const cmListFileBacktrace &bt)
    : Value(value), Backtrace(bt)
  {}